

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O1

void __thiscall
reactor::event_demultiplexer(reactor *this,int *epollfd,epoll_event *events,int *ret,int *listenfd)

{
  int fd;
  long lVar1;
  
  if (0 < *ret) {
    lVar1 = 0;
    do {
      fd = (events->data).fd;
      if ((fd == *listenfd) && ((events->events & 1) != 0)) {
        listen_handle(this,epollfd,fd);
      }
      else if ((events->events & 1) == 0) {
        if ((events->events & 4) != 0) {
          write_handle(this,epollfd,fd);
        }
      }
      else {
        read_handle(this,epollfd,fd);
      }
      lVar1 = lVar1 + 1;
      events = events + 1;
    } while (lVar1 < *ret);
  }
  return;
}

Assistant:

void reactor::event_demultiplexer(const int &epollfd,struct epoll_event *events,const int &ret,const int &listenfd){
    int i,fd;
    for(i=0;i<ret;i++){
        fd=events[i].data.fd;
        if((fd==listenfd)&&events[i].events&EPOLLIN)
            reactor::listen_handle(epollfd,fd);
        else if(events[i].events&EPOLLIN)
            reactor::read_handle(epollfd,fd);
        else if(events[i].events&EPOLLOUT)
            reactor::write_handle(epollfd,fd);
    }
}